

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O0

Ptr<Device>
myvk::Device::Create
          (Ptr<PhysicalDevice> *physical_device,QueueSelectorFunc *queue_selector_func,
          PhysicalDeviceFeatures *features,
          vector<const_char_*,_std::allocator<const_char_*>_> *extensions)

{
  bool bVar1;
  VkResult VVar2;
  Device *in_RCX;
  PhysicalDeviceFeatures *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Ptr<Device> PVar3;
  vector<float,_std::allocator<float>_> queue_priorities;
  vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> queue_create_infos;
  QueueSelectionResolver queue_resolver;
  vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_> queue_selections;
  shared_ptr<myvk::Device> ret;
  PhysicalDeviceFeatures *in_stack_fffffffffffffeb8;
  Device *in_stack_fffffffffffffec0;
  VkResult in_stack_fffffffffffffed0;
  VkResult in_stack_fffffffffffffed4;
  function<std::vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>_(const_std::shared_ptr<const_myvk::PhysicalDevice>_&)>
  *in_stack_fffffffffffffed8;
  Device *this;
  vector<const_char_*,_std::allocator<const_char_*>_> *extensions_00;
  vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>
  *in_stack_ffffffffffffff18;
  Device *in_stack_ffffffffffffff20;
  element_type *in_stack_ffffffffffffff30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffff38;
  QueueSelectionResolver *in_stack_ffffffffffffff40;
  Ptr<Device> *in_stack_ffffffffffffff68;
  QueueSelectionResolver *in_stack_ffffffffffffff70;
  
  std::make_shared<myvk::Device>();
  std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x2b4655
            );
  std::shared_ptr<myvk::PhysicalDevice>::operator=
            ((shared_ptr<myvk::PhysicalDevice> *)in_stack_fffffffffffffec0,
             (shared_ptr<myvk::PhysicalDevice> *)in_stack_fffffffffffffeb8);
  extensions_00 = (vector<const_char_*,_std::allocator<const_char_*>_> *)&stack0xffffffffffffffa0;
  std::shared_ptr<myvk::PhysicalDevice_const>::shared_ptr<myvk::PhysicalDevice,void>
            ((shared_ptr<const_myvk::PhysicalDevice> *)in_stack_fffffffffffffec0,
             (shared_ptr<myvk::PhysicalDevice> *)in_stack_fffffffffffffeb8);
  std::
  function<std::vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>_(const_std::shared_ptr<const_myvk::PhysicalDevice>_&)>
  ::operator()(in_stack_fffffffffffffed8,
               (shared_ptr<const_myvk::PhysicalDevice> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  std::shared_ptr<const_myvk::PhysicalDevice>::~shared_ptr
            ((shared_ptr<const_myvk::PhysicalDevice> *)0x2b46b3);
  bVar1 = std::vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>::empty
                    ((vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_> *)
                     CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  if (bVar1) {
    std::shared_ptr<myvk::Device>::shared_ptr
              ((shared_ptr<myvk::Device> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  else {
    QueueSelectionResolver::QueueSelectionResolver
              ((QueueSelectionResolver *)
               queue_resolver.m_queue_creations._M_t._M_impl.super__Rb_tree_header._M_header._M_left
               ,(Ptr<PhysicalDevice> *)
                queue_resolver.m_queue_creations._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent,
               (vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_> *)
               queue_resolver.m_queue_creations._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
    std::vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>::vector
              ((vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> *)0x2b4738
              );
    this = (Device *)&stack0xffffffffffffff18;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x2b4747);
    QueueSelectionResolver::EnumerateDeviceQueueCreateInfos
              (in_stack_ffffffffffffff40,
               (vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> *)
               in_stack_ffffffffffffff38._M_pi,
               (vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff30);
    std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2b476d);
    in_stack_fffffffffffffed4 =
         create_device(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,extensions_00,in_RDX);
    if (in_stack_fffffffffffffed4 == VK_SUCCESS) {
      std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2b4817);
      volkLoadDevice((VkDevice)0x2b4823);
      std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x2b4832);
      in_stack_fffffffffffffed0 = create_allocator(in_RCX);
      if (in_stack_fffffffffffffed0 == VK_SUCCESS) {
        std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x2b4874);
        VVar2 = create_pipeline_cache(this);
        if (VVar2 == VK_SUCCESS) {
          std::__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<myvk::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x2b48c0);
          PhysicalDeviceFeatures::operator=
                    ((PhysicalDeviceFeatures *)in_RCX,in_stack_fffffffffffffeb8);
          QueueSelectionResolver::FetchDeviceQueues
                    (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          std::shared_ptr<myvk::Device>::shared_ptr
                    ((shared_ptr<myvk::Device> *)in_RCX,
                     (shared_ptr<myvk::Device> *)in_stack_fffffffffffffeb8);
        }
        else {
          std::shared_ptr<myvk::Device>::shared_ptr
                    ((shared_ptr<myvk::Device> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8
                    );
          in_RCX = in_stack_fffffffffffffec0;
        }
      }
      else {
        std::shared_ptr<myvk::Device>::shared_ptr
                  ((shared_ptr<myvk::Device> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
        in_RCX = in_stack_fffffffffffffec0;
      }
    }
    else {
      std::shared_ptr<myvk::Device>::shared_ptr
                ((shared_ptr<myvk::Device> *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      in_RCX = in_stack_fffffffffffffec0;
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    std::vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_>::~vector
              ((vector<VkDeviceQueueCreateInfo,_std::allocator<VkDeviceQueueCreateInfo>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    QueueSelectionResolver::~QueueSelectionResolver((QueueSelectionResolver *)in_RCX);
  }
  std::vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_>::~vector
            ((vector<myvk::QueueSelection,_std::allocator<myvk::QueueSelection>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  std::shared_ptr<myvk::Device>::~shared_ptr((shared_ptr<myvk::Device> *)0x2b4942);
  PVar3.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<Device>)PVar3.super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Device> Device::Create(const Ptr<PhysicalDevice> &physical_device, const QueueSelectorFunc& queue_selector_func,
                           const PhysicalDeviceFeatures &features, const std::vector<const char *> &extensions) {
	auto ret = std::make_shared<Device>();
	ret->m_physical_device_ptr = physical_device;

	std::vector<QueueSelection> queue_selections = queue_selector_func(physical_device);
	if (queue_selections.empty())
		return nullptr;
	QueueSelectionResolver queue_resolver{physical_device, std::move(queue_selections)};
	std::vector<VkDeviceQueueCreateInfo> queue_create_infos;
	std::vector<float> queue_priorities;
	queue_resolver.EnumerateDeviceQueueCreateInfos(&queue_create_infos, &queue_priorities);

	if (ret->create_device(queue_create_infos, extensions, features) != VK_SUCCESS)
		return nullptr;
	volkLoadDevice(ret->m_device);
	if (ret->create_allocator() != VK_SUCCESS)
		return nullptr;
	if (ret->create_pipeline_cache() != VK_SUCCESS)
		return nullptr;
	ret->m_features = features;
	queue_resolver.FetchDeviceQueues(ret);
	return ret;
}